

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator+=
          (Fad<Fad<double>> *this,FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> *x)

{
  uint ssize;
  uint uVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  Fad<double> *pFVar4;
  value_type local_50;
  
  ssize = (((x->fadexpr_).left_)->dx_).num_elts;
  if (ssize != 0) {
    uVar1 = *(uint *)(this + 0x28);
    if (uVar1 == 0) {
      Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),ssize);
      pFVar4 = *(Fad<double> **)(this + 0x30);
      uVar1 = 0;
      if (0 < (int)ssize) {
        uVar1 = ssize;
      }
      if ((((x->fadexpr_).left_)->dx_).num_elts == 0) {
        for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
          FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::dx(&local_50,&x->fadexpr_,(int)uVar3);
          Fad<double>::operator=(pFVar4,&local_50);
          Fad<double>::~Fad(&local_50);
          pFVar4 = pFVar4 + 1;
        }
      }
      else {
        for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
          FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
                    (&local_50,&x->fadexpr_,(int)uVar3);
          Fad<double>::operator=(pFVar4,&local_50);
          Fad<double>::~Fad(&local_50);
          pFVar4 = pFVar4 + 1;
        }
      }
    }
    else {
      pFVar4 = *(Fad<double> **)(this + 0x30);
      uVar2 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar2;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
                  (&local_50,&x->fadexpr_,(int)uVar2);
        Fad<double>::operator+=<double,_nullptr>(pFVar4,&local_50);
        Fad<double>::~Fad(&local_50);
        pFVar4 = pFVar4 + 1;
      }
    }
  }
  FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::val(&local_50,&x->fadexpr_);
  Fad<double>::operator+=<double,_nullptr>((Fad<double> *)(this + 8),&local_50);
  Fad<double>::~Fad(&local_50);
  return (Fad<Fad<double>_> *)this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}